

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_init_size(mp_int *a,int size)

{
  int iVar1;
  void *pvVar2;
  int in_ESI;
  undefined4 *in_RDI;
  int x;
  int local_18;
  int local_4;
  
  iVar1 = (0x40 - in_ESI % 0x20) + in_ESI;
  pvVar2 = malloc((long)iVar1 << 3);
  *(void **)(in_RDI + 4) = pvVar2;
  if (*(long *)(in_RDI + 4) == 0) {
    local_4 = -2;
  }
  else {
    *in_RDI = 0;
    in_RDI[1] = iVar1;
    in_RDI[2] = 0;
    for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 4) + (long)local_18 * 8) = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_init_size (mp_int * a, int size)
{
  int x;

  /* pad size so there are always extra digits */
  size += (MP_PREC * 2) - (size % MP_PREC);	
  
  /* alloc mem */
  a->dp = OPT_CAST(mp_digit) XMALLOC (sizeof (mp_digit) * size);
  if (a->dp == NULL) {
    return MP_MEM;
  }

  /* set the members */
  a->used  = 0;
  a->alloc = size;
  a->sign  = MP_ZPOS;

  /* zero the digits */
  for (x = 0; x < size; x++) {
      a->dp[x] = 0;
  }

  return MP_OKAY;
}